

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

int __thiscall amrex::ParmParse::countval(ParmParse *this,char *name,int n)

{
  Table *table;
  int iVar1;
  PP_entry *pPVar2;
  allocator local_61;
  string local_60;
  string local_40;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_60,name,&local_61);
  prefixedName(&local_40,this,&local_60);
  pPVar2 = anon_unknown_12::ppindex(table,n,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (pPVar2 == (PP_entry *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (int)((ulong)((long)(pPVar2->m_vals).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pPVar2->m_vals).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  }
  return iVar1;
}

Assistant:

int
ParmParse::countval (const char* name,
                     int         n) const
{
    //
    // First find n'th occurrence of name in table.
    //
    const PP_entry* def = ppindex(m_table, n, prefixedName(name), false);
    return def == 0 ? 0 : def->m_vals.size();
}